

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

void convert_32s_P2C2(OPJ_INT32 **pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length,OPJ_INT32 adjust)

{
  OPJ_INT32 *pOVar1;
  OPJ_INT32 *pOVar2;
  OPJ_INT32 *pSrc1;
  OPJ_INT32 *pSrc0;
  OPJ_SIZE_T i;
  OPJ_INT32 adjust_local;
  OPJ_SIZE_T length_local;
  OPJ_INT32 *pDst_local;
  OPJ_INT32 **pSrc_local;
  
  pOVar1 = *pSrc;
  pOVar2 = pSrc[1];
  for (pSrc0 = (OPJ_INT32 *)0x0; pSrc0 < length; pSrc0 = (OPJ_INT32 *)((long)pSrc0 + 1)) {
    pDst[(long)pSrc0 * 2] = pOVar1[(long)pSrc0] + adjust;
    pDst[(long)pSrc0 * 2 + 1] = pOVar2[(long)pSrc0] + adjust;
  }
  return;
}

Assistant:

static void convert_32s_P2C2(OPJ_INT32 const* const* pSrc, OPJ_INT32* pDst, OPJ_SIZE_T length, OPJ_INT32 adjust)
{
	OPJ_SIZE_T i;
	const OPJ_INT32* pSrc0 = pSrc[0];
	const OPJ_INT32* pSrc1 = pSrc[1];
	
	for (i = 0; i < length; i++) {
		pDst[2*i+0] = pSrc0[i] + adjust;
		pDst[2*i+1] = pSrc1[i] + adjust;
	}
}